

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

uint __thiscall BVFixed::DiffCount(BVFixed *this,BVFixed *bv)

{
  BVFixed *pBVar1;
  BVFixed *pBVar2;
  BVIndex BVar3;
  uint uVar4;
  BVFixed *this_00;
  uint uVar5;
  BVFixed *this_01;
  
  pBVar1 = this + 1;
  uVar5 = 0;
  pBVar2 = bv + 1;
  this_00 = pBVar1;
  for (this_01 = pBVar2;
      (BVar3 = WordCount(this), this_00 != pBVar1 + BVar3 &&
      (BVar3 = WordCount(bv), this_01 != pBVar2 + BVar3)); this_01 = this_01 + 1) {
    uVar4 = BVUnitT<unsigned_long>::DiffCount
                      ((BVUnitT<unsigned_long> *)this_00,(BVUnitT<unsigned_long>)*this_01);
    uVar5 = uVar5 + uVar4;
    this_00 = this_00 + 1;
  }
  for (; BVar3 = WordCount(this), this_00 != pBVar1 + BVar3; this_00 = this_00 + 1) {
    BVar3 = BVUnitT<unsigned_long>::Count((BVUnitT<unsigned_long> *)this_00);
    uVar5 = uVar5 + BVar3;
  }
  for (; BVar3 = WordCount(bv), this_01 != pBVar2 + BVar3; this_01 = this_01 + 1) {
    BVar3 = BVUnitT<unsigned_long>::Count((BVUnitT<unsigned_long> *)this_01);
    uVar5 = uVar5 + BVar3;
  }
  return uVar5;
}

Assistant:

uint
BVFixed::DiffCount(const BVFixed*bv) const
{
    const BVUnit *i, *j;
    uint count = 0;
    for(i  =  this->BeginUnit(), j = bv->BeginUnit();
        i !=  this->EndUnit() && j != bv->EndUnit();
        i++, j++)
    {
        count += i->DiffCount(*j);
    }

    // Assumes that the default value of is 0
    while(i != this->EndUnit())
    {
        count += i->Count();
        i++;
    }
    while(j != bv->EndUnit())
    {
        count += j->Count();
        j++;
    }
    return count;
}